

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeDrawList(ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImDrawVert *pIVar3;
  ImGuiTable *table;
  ImGuiContext *pIVar4;
  unsigned_short *puVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  ImDrawList *pIVar10;
  long lVar11;
  uint uVar12;
  ImGuiContext *g;
  char *pcVar13;
  ImVec4 *buf_00;
  int iVar14;
  long lVar15;
  ImDrawCmd *pIVar16;
  float fVar17;
  double dVar18;
  undefined1 auVar19 [16];
  ImGuiListClipper clipper;
  ImVec2 triangle_1 [3];
  char buf [300];
  ImGuiListClipper local_1f8;
  ImDrawList *local_1d8;
  ImGuiContext *local_1d0;
  ImDrawCmd *local_1c8;
  unsigned_short *local_1c0;
  ImDrawList *local_1b8;
  long local_1b0;
  ulong local_1a8;
  ImVec2 local_1a0;
  ImVec2 local_198 [4];
  undefined1 local_178 [16];
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  iVar14 = (draw_list->CmdBuffer).Size;
  lVar15 = (long)iVar14;
  if ((0 < lVar15) && (pIVar16 = (draw_list->CmdBuffer).Data, pIVar16[lVar15 + -1].ElemCount == 0))
  {
    iVar14 = iVar14 - (uint)(pIVar16[lVar15 + -1].UserCallback == (ImDrawCallback)0x0);
  }
  local_1d0 = GImGui;
  pcVar13 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar13 = draw_list->_OwnerName;
  }
  bVar6 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,pcVar13,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar14);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->DrawList == draw_list) {
    pIVar2->WriteAccessed = true;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar6) {
      return;
    }
  }
  else {
    pIVar10 = GetForegroundDrawList();
    if ((window != (ImGuiWindow *)0x0) && (bVar7 = IsItemHovered(0), bVar7)) {
      auVar19._0_4_ = (window->Pos).x + (window->Size).x;
      auVar19._4_4_ = (window->Pos).y + (window->Size).y;
      auVar19._8_8_ = 0;
      local_168[0]._0_8_ = vmovlps_avx(auVar19);
      ImDrawList::AddRect(pIVar10,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
    }
    if (!bVar6) {
      return;
    }
    if ((window != (ImGuiWindow *)0x0) && (window->WasActive == false)) {
      TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
    }
    if (0 < iVar14) {
      pIVar16 = (draw_list->CmdBuffer).Data;
      local_178._8_4_ = 0x7fffffff;
      local_178._0_8_ = 0x7fffffff7fffffff;
      local_178._12_4_ = 0x7fffffff;
      local_1b0 = (long)iVar14 * 0x38;
      local_1d8 = pIVar10;
      local_1b8 = draw_list;
      do {
        if (pIVar16->UserCallback == (ImDrawCallback)0x0) {
          ImFormatString((char *)local_168,300,
                         "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         (double)(pIVar16->ClipRect).x,(double)(pIVar16->ClipRect).y,
                         (double)(pIVar16->ClipRect).z,(double)(pIVar16->ClipRect).w,
                         (ulong)pIVar16->ElemCount / 3,pIVar16->TextureId);
          bVar6 = TreeNode((void *)(((long)pIVar16 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                   0x6db6db6db6db6db7),"%s",local_168);
          bVar7 = IsItemHovered(0);
          if (bVar7) {
            bVar7 = (local_1d0->DebugMetricsConfig).ShowDrawCmdMesh;
            if (bVar7 == false) {
              if ((local_1d8 != (ImDrawList *)0x0) &&
                 ((local_1d0->DebugMetricsConfig).ShowDrawCmdBoundingBoxes != false))
              goto LAB_00165088;
            }
            else if (local_1d8 != (ImDrawList *)0x0) {
LAB_00165088:
              DebugNodeDrawCmdShowMeshAndBoundingBox
                        (local_1d8,draw_list,pIVar16,bVar7,
                         (local_1d0->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
            }
          }
          pIVar10 = local_1d8;
          if (bVar6) {
            if ((draw_list->IdxBuffer).Size < 1) {
              local_1c0 = (unsigned_short *)0x0;
            }
            else {
              local_1c0 = (draw_list->IdxBuffer).Data;
            }
            uVar1 = pIVar16->VtxOffset;
            uVar8 = pIVar16->IdxOffset;
            pIVar3 = (draw_list->VtxBuffer).Data;
            uVar12 = pIVar16->ElemCount;
            dVar18 = 0.0;
            if (uVar8 < uVar12 + uVar8) {
              fVar17 = 0.0;
              do {
                local_1f8.DisplayStart = 0;
                local_1f8.DisplayEnd = 0;
                local_1f8.ItemsCount = 0;
                local_1f8.StepNo = 0;
                local_1f8.ItemsFrozen = 0;
                local_1f8.ItemsHeight = 0.0;
                lVar15 = 0;
                do {
                  uVar12 = (uint)((ulong)uVar8 + lVar15);
                  if (local_1c0 != (unsigned_short *)0x0) {
                    uVar12 = (uint)local_1c0[(ulong)uVar8 + lVar15 & 0xffffffff];
                  }
                  *(ImVec2 *)(&local_1f8.DisplayStart + lVar15 * 2) =
                       pIVar3[(ulong)uVar1 + (ulong)uVar12].pos;
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
                auVar19 = vandps_avx(ZEXT416((uint)(((float)local_1f8.DisplayEnd -
                                                    (float)local_1f8.StepNo) *
                                                    (float)local_1f8.ItemsFrozen +
                                                   ((float)local_1f8.StepNo - local_1f8.ItemsHeight)
                                                   * (float)local_1f8.DisplayStart +
                                                   (local_1f8.ItemsHeight -
                                                   (float)local_1f8.DisplayEnd) *
                                                   (float)local_1f8.ItemsCount)),local_178);
                fVar17 = fVar17 + auVar19._0_4_ * 0.5;
                uVar12 = pIVar16->ElemCount;
                uVar8 = uVar8 + 3;
              } while (uVar8 < uVar12 + pIVar16->IdxOffset);
              dVar18 = (double)fVar17;
              uVar8 = pIVar16->IdxOffset;
            }
            bVar7 = local_1d8 != (ImDrawList *)0x0;
            ImFormatString((char *)local_168,300,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           dVar18,(ulong)uVar12,(ulong)pIVar16->VtxOffset,(ulong)uVar8);
            local_1f8.DisplayStart = 0;
            local_1f8.DisplayEnd = 0;
            Selectable((char *)local_168,false,0,(ImVec2 *)&local_1f8);
            bVar6 = IsItemHovered(0);
            if (bVar7 && bVar6) {
              DebugNodeDrawCmdShowMeshAndBoundingBox(pIVar10,draw_list,pIVar16,true,false);
            }
            ImGuiListClipper::ImGuiListClipper(&local_1f8);
            uVar8 = pIVar16->ElemCount;
            pIVar2 = GImGui->CurrentWindow;
            table = GImGui->CurrentTable;
            local_1c8 = pIVar16;
            if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
              TableEndRow(table);
            }
            local_1f8.StartPosY = (pIVar2->DC).CursorPos.y;
            local_1f8.ItemsHeight = -1.0;
            local_1f8.ItemsCount = uVar8 / 3;
            local_1f8.StepNo = 0;
            local_1f8.ItemsFrozen = 0;
            local_1f8.DisplayStart = -1;
            local_1f8.DisplayEnd = 0;
            while (bVar6 = ImGuiListClipper::Step(&local_1f8), bVar6) {
              if (local_1f8.DisplayStart < local_1f8.DisplayEnd) {
                iVar14 = local_1f8.DisplayStart * 3 + local_1c8->IdxOffset;
                uVar8 = local_1f8.DisplayStart;
                do {
                  puVar5 = local_1c0;
                  local_1a8 = (ulong)uVar8;
                  local_198[0].x = 0.0;
                  local_198[0].y = 0.0;
                  local_198[1].x = 0.0;
                  local_198[1].y = 0.0;
                  local_198[2].x = 0.0;
                  local_198[2].y = 0.0;
                  lVar15 = 0;
                  buf_00 = local_168;
                  do {
                    if (local_1c0 == (unsigned_short *)0x0) {
                      uVar8 = iVar14 + (int)lVar15;
                    }
                    else {
                      uVar8 = (uint)puVar5[iVar14 + lVar15];
                    }
                    lVar11 = (long)(int)uVar8;
                    local_198[lVar15] = pIVar3[(ulong)uVar1 + lVar11].pos;
                    pcVar13 = "     ";
                    if (lVar15 == 0) {
                      pcVar13 = "Vert:";
                    }
                    iVar9 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                           "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                           (double)pIVar3[(ulong)uVar1 + lVar11].pos.x,
                                           (double)pIVar3[(ulong)uVar1 + lVar11].pos.y,
                                           (double)pIVar3[(ulong)uVar1 + lVar11].uv.x,
                                           (double)pIVar3[(ulong)uVar1 + lVar11].uv.y,pcVar13,
                                           (ulong)(uint)(iVar14 + (int)lVar15),
                                           (ulong)pIVar3[(ulong)uVar1 + lVar11].col);
                    buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar9);
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_1a0.x = 0.0;
                  local_1a0.y = 0.0;
                  Selectable((char *)local_168,false,0,&local_1a0);
                  pIVar10 = local_1d8;
                  if ((local_1d8 != (ImDrawList *)0x0) && (bVar6 = IsItemHovered(0), bVar6)) {
                    uVar8 = pIVar10->Flags;
                    pIVar10->Flags = uVar8 & 0xfffffffe;
                    ImDrawList::AddPolyline(pIVar10,local_198,3,0xff00ffff,true,1.0);
                    pIVar10->Flags = uVar8;
                  }
                  iVar14 = iVar14 + 3;
                  uVar8 = (int)local_1a8 + 1;
                } while ((int)uVar8 < local_1f8.DisplayEnd);
              }
            }
            TreePop();
            ImGuiListClipper::~ImGuiListClipper(&local_1f8);
            draw_list = local_1b8;
            pIVar16 = local_1c8;
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar16->UserCallback,pIVar16->UserCallbackData);
        }
        pIVar16 = pIVar16 + 1;
      } while (pIVar16 < (ImDrawCmd *)
                         ((long)&(((draw_list->CmdBuffer).Data)->ClipRect).x + local_1b0));
    }
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    if (window && IsItemHovered())
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
            pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}